

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmTargetCollectLinkLanguages::Visit(cmTargetCollectLinkLanguages *this,cmLinkItem *item)

{
  PolicyStatus PVar1;
  cmLinkInterface *pcVar2;
  long lVar3;
  ostream *poVar4;
  cmake *this_00;
  PolicyID id;
  MessageType t;
  pointer __obj;
  pointer item_00;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar5;
  string local_1e0;
  cmListFileBacktrace local_1c0;
  ostringstream e;
  
  if (item->Target == (cmGeneratorTarget *)0x0) {
    lVar3 = std::__cxx11::string::find((char *)item,0x562084);
    if (lVar3 != -1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      PVar1 = cmLocalGenerator::GetPolicyStatus(this->Target->LocalGenerator,CMP0028);
      if (PVar1 != OLD) {
        if (PVar1 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e0,(cmPolicies *)0x1c,id);
          poVar4 = std::operator<<((ostream *)&e,(string *)&local_1e0);
          std::operator<<(poVar4,"\n");
          std::__cxx11::string::~string((string *)&local_1e0);
          t = AUTHOR_WARNING;
        }
        else {
          t = FATAL_ERROR;
        }
        poVar4 = std::operator<<((ostream *)&e,"Target \"");
        poVar4 = std::operator<<(poVar4,(string *)&this->Target->Target->Name);
        poVar4 = std::operator<<(poVar4,"\" links to target \"");
        poVar4 = std::operator<<(poVar4,(string *)item);
        std::operator<<(poVar4,
                        "\" but the target was not found.  Perhaps a find_package() call is missing for an IMPORTED target, or an ALIAS target is missing?"
                       );
        this_00 = cmLocalGenerator::GetCMakeInstance(this->Target->LocalGenerator);
        std::__cxx11::stringbuf::str();
        cmGeneratorTarget::GetBacktrace(&local_1c0,this->Target);
        cmake::IssueMessage(this_00,t,&local_1e0,&local_1c0);
        cmListFileBacktrace::~cmListFileBacktrace(&local_1c0);
        std::__cxx11::string::~string((string *)&local_1e0);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
  }
  else {
    pVar5 = std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>
                      ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                        *)&this->Visited,&item->Target);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar2 = cmGeneratorTarget::GetLinkInterface(item->Target,&this->Config,this->HeadTarget);
      if (pcVar2 != (cmLinkInterface *)0x0) {
        for (__obj = (pcVar2->Languages).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            __obj != (pcVar2->Languages).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; __obj = __obj + 1) {
          cmsys::
          hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
          ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                    *)&e,this->Languages,__obj);
        }
        for (item_00 = (pcVar2->super_cmLinkInterfaceLibraries).Libraries.
                       super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                       super__Vector_impl_data._M_start;
            item_00 !=
            (pcVar2->super_cmLinkInterfaceLibraries).Libraries.
            super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
            super__Vector_impl_data._M_finish; item_00 = item_00 + 1) {
          Visit(this,item_00);
        }
      }
    }
  }
  return;
}

Assistant:

void Visit(cmLinkItem const& item)
  {
    if (!item.Target) {
      if (item.find("::") != std::string::npos) {
        bool noMessage = false;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        std::ostringstream e;
        switch (this->Target->GetLocalGenerator()->GetPolicyStatus(
          cmPolicies::CMP0028)) {
          case cmPolicies::WARN: {
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0028) << "\n";
            messageType = cmake::AUTHOR_WARNING;
          } break;
          case cmPolicies::OLD:
            noMessage = true;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            // Issue the fatal message.
            break;
        }

        if (!noMessage) {
          e << "Target \"" << this->Target->GetName()
            << "\" links to target \"" << item
            << "\" but the target was not found.  Perhaps a find_package() "
               "call is missing for an IMPORTED target, or an ALIAS target is "
               "missing?";
          this->Target->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
            messageType, e.str(), this->Target->GetBacktrace());
        }
      }
      return;
    }
    if (!this->Visited.insert(item.Target).second) {
      return;
    }
    cmLinkInterface const* iface =
      item.Target->GetLinkInterface(this->Config, this->HeadTarget);
    if (!iface) {
      return;
    }

    for (std::vector<std::string>::const_iterator li =
           iface->Languages.begin();
         li != iface->Languages.end(); ++li) {
      this->Languages.insert(*li);
    }

    for (std::vector<cmLinkItem>::const_iterator li = iface->Libraries.begin();
         li != iface->Libraries.end(); ++li) {
      this->Visit(*li);
    }
  }